

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiletime_test.cpp
# Opt level: O2

void operations_test<viennamath::ct_constant<8l>,viennamath::ct_constant<8l>>
               (ct_constant<8L> *t,ct_constant<8L> *u,double t2,double u2)

{
  ostream *poVar1;
  ct_constant<64L> local_26;
  ct_constant<64L> local_25;
  ct_constant<0L> local_24;
  ct_constant<0L> local_23;
  ct_constant<16L> local_22;
  ct_constant<16L> local_21;
  double local_20;
  ct_binary_expr<viennamath::ct_constant<8L>,_viennamath::op_div<double>,_viennamath::ct_constant<8L>_>
  local_14;
  ct_binary_expr<viennamath::ct_constant<8L>,_viennamath::op_div<double>,_viennamath::ct_constant<8L>_>
  local_12;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"LHS: ");
  poVar1 = viennamath::operator<<(poVar1,t);
  std::operator<<(poVar1," (");
  poVar1 = std::ostream::_M_insert<double>(t2);
  poVar1 = std::operator<<(poVar1,"), RHS: ");
  poVar1 = viennamath::operator<<(poVar1,u);
  std::operator<<(poVar1,"(");
  poVar1 = std::ostream::_M_insert<double>(u2);
  poVar1 = std::operator<<(poVar1,")");
  std::endl<char,std::char_traits<char>>(poVar1);
  local_20 = t2 + u2;
  evaluations_test<viennamath::ct_constant<16l>>(&local_21,local_20);
  evaluations_test<viennamath::ct_constant<16l>>(&local_22,local_20);
  evaluations_test<viennamath::ct_constant<0l>>(&local_23,t2 - u2);
  evaluations_test<viennamath::ct_constant<0l>>(&local_24,u2 - t2);
  local_20 = t2 * u2;
  evaluations_test<viennamath::ct_constant<64l>>(&local_25,local_20);
  evaluations_test<viennamath::ct_constant<64l>>(&local_26,local_20);
  evaluations_test<viennamath::ct_binary_expr<viennamath::ct_constant<8l>,viennamath::op_div<double>,viennamath::ct_constant<8l>>>
            (&local_12,t2 / u2);
  evaluations_test<viennamath::ct_binary_expr<viennamath::ct_constant<8l>,viennamath::op_div<double>,viennamath::ct_constant<8l>>>
            (&local_14,u2 / t2);
  return;
}

Assistant:

void operations_test(T const & t, U const & u, double t2, double u2)
{
  std::cout << "LHS: " << t << " (" << t2 << "), RHS: " << u << "(" << u2 << ")" << std::endl;
  evaluations_test(t + u, t2 + u2);
  evaluations_test(u + t, u2 + t2);
  evaluations_test(t - u, t2 - u2);
  evaluations_test(u - t, u2 - t2);
  evaluations_test(t * u, t2 * u2);
  evaluations_test(u * t, u2 * t2);
  evaluations_test(t / u, t2 / u2);
  evaluations_test(u / t, u2 / t2);
}